

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::HoistInvariantValueInfo
          (GlobOpt *this,ValueInfo *invariantValueInfoToHoist,Value *valueToUpdate,
          BasicBlock *targetBlock)

{
  Sym *sym;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (invariantValueInfoToHoist == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d7c,"(invariantValueInfoToHoist)","invariantValueInfoToHoist");
    if (!bVar2) goto LAB_0046fade;
    *puVar3 = 0;
  }
  if (valueToUpdate == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d7d,"(valueToUpdate)","valueToUpdate");
    if (!bVar2) goto LAB_0046fade;
    *puVar3 = 0;
  }
  if (targetBlock == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d7e,"(targetBlock)","targetBlock");
    if (!bVar2) goto LAB_0046fade;
    *puVar3 = 0;
  }
  bVar2 = ValueInfo::IsJsType(invariantValueInfoToHoist);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x3d81,"(!invariantValueInfoToHoist->IsJsType())",
                       "!invariantValueInfoToHoist->IsJsType()");
    if (!bVar2) {
LAB_0046fade:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  sym = valueToUpdate->valueInfo->symStore;
  if (invariantValueInfoToHoist->symStore != sym) {
    invariantValueInfoToHoist = ValueInfo::Copy(invariantValueInfoToHoist,this->alloc);
    GlobOptBlockData::SetChangedSym
              (&this->currentBlock->globOptData,invariantValueInfoToHoist->symStore);
    ValueInfo::SetSymStore(invariantValueInfoToHoist,sym);
  }
  ChangeValueInfo(this,targetBlock,valueToUpdate,invariantValueInfoToHoist,true,false);
  return;
}

Assistant:

void
GlobOpt::HoistInvariantValueInfo(
    ValueInfo *const invariantValueInfoToHoist,
    Value *const valueToUpdate,
    BasicBlock *const targetBlock)
{
    Assert(invariantValueInfoToHoist);
    Assert(valueToUpdate);
    Assert(targetBlock);

    // Why are we trying to change the value type of the type sym value? Asserting here to make sure we don't deep copy the type sym's value info.
    Assert(!invariantValueInfoToHoist->IsJsType());

    Sym *const symStore = valueToUpdate->GetValueInfo()->GetSymStore();
    ValueInfo *newValueInfo;
    if(invariantValueInfoToHoist->GetSymStore() == symStore)
    {
        newValueInfo = invariantValueInfoToHoist;
    }
    else
    {
        newValueInfo = invariantValueInfoToHoist->Copy(alloc);
        this->SetSymStoreDirect(newValueInfo, symStore);
    }
    ChangeValueInfo(targetBlock, valueToUpdate, newValueInfo, true);
}